

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

RGB pbrt::Mul<pbrt::RGB,3,pbrt::ImageChannelValues>(SquareMatrix<3> *m,ImageChannelValues *v)

{
  RGB RVar1;
  Float *pFVar2;
  float *pfVar3;
  const_reference pvVar4;
  int j;
  int i;
  RGB result;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  span<const_float> local_38;
  int local_28;
  int local_24;
  RGB local_c;
  
  RGB::RGB(&local_c);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    pFVar2 = RGB::operator[](&local_c,local_24);
    *pFVar2 = 0.0;
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      local_38 = SquareMatrix<3>::operator[]
                           ((SquareMatrix<3> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac);
      pfVar3 = pstd::span<const_float>::operator[](&local_38,(long)local_28);
      in_stack_ffffffffffffffb0 = *pfVar3;
      pvVar4 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb0 * *pvVar4;
      pFVar2 = RGB::operator[](&local_c,local_24);
      *pFVar2 = in_stack_ffffffffffffffb4 + *pFVar2;
    }
  }
  RVar1.b = local_c.b;
  RVar1.r = local_c.r;
  RVar1.g = local_c.g;
  return RVar1;
}

Assistant:

PBRT_CPU_GPU inline Tresult Mul(const SquareMatrix<N> &m, const T &v) {
    Tresult result;
    for (int i = 0; i < N; ++i) {
        result[i] = 0;
        for (int j = 0; j < N; ++j)
            result[i] += m[i][j] * v[j];
    }
    return result;
}